

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::attachNamesTest(TestContext *testCtx,Context *context)

{
  ulong in_RAX;
  deUint32 reservedRboName;
  deUint32 reservedTexName;
  
  _reservedRboName = in_RAX;
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[7])(context,1,&reservedTexName);
  logComment(testCtx,"Attaching allocated texture name to 2D target");
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,_reservedRboName >> 0x20,0);
  checkError(testCtx,context,0x502);
  logComment(testCtx,"Attaching allocated texture name to cube target");
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0x8516,_reservedRboName >> 0x20,0);
  checkError(testCtx,context,0x502);
  (*context->_vptr_Context[0xd])(context,1,&reservedRboName);
  logComment(testCtx,"Attaching allocated renderbuffer name");
  (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,_reservedRboName & 0xffffffff);
  checkError(testCtx,context,0x502);
  return;
}

Assistant:

static void attachNamesTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Just allocate some names, don't bind for storage
	deUint32 reservedTexName;
	context.genTextures(1, &reservedTexName);

	logComment(testCtx, "Attaching allocated texture name to 2D target");
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, reservedTexName, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching allocated texture name to cube target");
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, reservedTexName, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	deUint32 reservedRboName;
	context.genRenderbuffers(1, &reservedRboName);

	logComment(testCtx, "Attaching allocated renderbuffer name");
	context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, reservedRboName);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}